

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLog.cpp
# Opt level: O0

void __thiscall Rml::Debugger::ElementLog::AddLogMessage(ElementLog *this,Type type,String *message)

{
  ElementDocument *pEVar1;
  LogMessageList *this_00;
  size_type sVar2;
  ulong uVar3;
  string *psVar4;
  Element *beacon_button;
  allocator<char> local_c1;
  string local_c0 [32];
  string *local_a0;
  Element *button;
  string local_88 [32];
  undefined1 local_68 [8];
  LogMessage log_message;
  __normal_iterator<Rml::Debugger::ElementLog::LogMessage_*,_std::vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>_>
  local_38;
  const_iterator local_30;
  LogMessageList *local_28;
  LogMessageList *log_message_list;
  String *message_local;
  ElementLog *pEStack_10;
  Type type_local;
  ElementLog *this_local;
  
  local_28 = &this->log_types[type].log_messages;
  log_message_list = (LogMessageList *)message;
  message_local._4_4_ = type;
  pEStack_10 = this;
  sVar2 = std::
          vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
          ::size(local_28);
  this_00 = local_28;
  if (0x31 < sVar2) {
    local_38._M_current =
         (LogMessage *)
         std::
         vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
         ::begin(local_28);
    __gnu_cxx::
    __normal_iterator<Rml::Debugger::ElementLog::LogMessage_const*,std::vector<Rml::Debugger::ElementLog::LogMessage,std::allocator<Rml::Debugger::ElementLog::LogMessage>>>
    ::__normal_iterator<Rml::Debugger::ElementLog::LogMessage*>
              ((__normal_iterator<Rml::Debugger::ElementLog::LogMessage_const*,std::vector<Rml::Debugger::ElementLog::LogMessage,std::allocator<Rml::Debugger::ElementLog::LogMessage>>>
                *)&local_30,&local_38);
    log_message.message.field_2._8_8_ =
         std::
         vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
         ::erase(this_00,local_30);
  }
  LogMessage::LogMessage((LogMessage *)local_68);
  local_68._0_4_ = this->current_index;
  this->current_index = local_68._0_4_ + 1;
  Rml::StringUtilities::EncodeRml(local_88);
  std::__cxx11::string::operator=((string *)&log_message,local_88);
  std::__cxx11::string::~string(local_88);
  std::
  vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
  ::push_back(local_28,(value_type *)local_68);
  if ((this->log_types[message_local._4_4_].visible & 1U) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (psVar4 = (string *)Rml::Element::GetElementById((string *)this), local_a0 = psVar4,
       psVar4 != (string *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_c0,"Off*",&local_c1);
      Rml::Element::SetInnerRML(psVar4);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
  }
  else if ((this->beacon != (ElementDocument *)0x0) &&
          ((int)message_local._4_4_ < this->current_beacon_level)) {
    pEVar1 = this->beacon;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>
              ((Property *)&beacon_button,Visible);
    Rml::Element::SetProperty((PropertyId)pEVar1,(Property *)0x2a);
    Property::~Property((Property *)&beacon_button);
    this->current_beacon_level = message_local._4_4_;
    psVar4 = (string *)Rml::Element::GetFirstChild();
    if (psVar4 != (string *)0x0) {
      Rml::Element::SetClassNames(psVar4);
      Rml::Element::SetInnerRML(psVar4);
    }
    Rml::ElementDocument::UpdateDocument();
  }
  this->dirty_logs = true;
  LogMessage::~LogMessage((LogMessage *)local_68);
  return;
}

Assistant:

void ElementLog::AddLogMessage(Log::Type type, const String& message)
{
	LogMessageList& log_message_list = log_types[type].log_messages;
	if (log_message_list.size() >= MAX_LOG_MESSAGES)
	{
		log_message_list.erase(log_message_list.begin());
	}

	// Add the message to the list of messages for the specified log type.
	LogMessage log_message;
	log_message.index = current_index++;
	log_message.message = StringUtilities::EncodeRml(message);
	log_message_list.push_back(log_message);

	// If this log type is invisible, and there is a button for this log type, then change its text from
	// "Off" to "Off*" to signal that there are unread logs.
	if (!log_types[type].visible)
	{
		if (!log_types[type].button_name.empty())
		{
			Element* button = GetElementById(log_types[type].button_name);
			if (button)
			{
				button->SetInnerRML("Off*");
			}
		}
	}
	// Trigger the beacon if we're hidden. Override any lower-level log type if it is already visible.
	else
	{
		if (beacon != nullptr)
		{
			if (type < current_beacon_level)
			{
				beacon->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

				current_beacon_level = type;
				Element* beacon_button = beacon->GetFirstChild();
				if (beacon_button)
				{
					beacon_button->SetClassNames(log_types[type].class_name);
					beacon_button->SetInnerRML(log_types[type].alert_contents);
				}

				// We need to update the document manually in case the beacon appears during context update.
				beacon->UpdateDocument();
			}
		}
	}

	// Force a refresh of the RML.
	dirty_logs = true;
}